

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBCellFlag.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *os,EBCellFlag *flag)

{
  uint *puVar1;
  void *this;
  ostream *poVar2;
  uint *in_RSI;
  ostream *in_RDI;
  int i;
  int j;
  int k;
  fmtflags old_fmt;
  int n;
  int k_1;
  int j_1;
  int i_1;
  IntVect local_9c;
  int local_90;
  int local_8c;
  int local_88;
  fmtflags local_84;
  uint *local_80;
  ostream *local_78;
  uint *local_70;
  uint *local_68;
  uint *local_60;
  uint *local_58;
  int local_50;
  IntVect *local_40;
  uint *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_80 = in_RSI;
  local_78 = in_RDI;
  local_84 = std::ios_base::flags((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = (void *)std::ostream::operator<<(local_78,std::hex);
  local_70 = local_80;
  poVar2 = (ostream *)std::ostream::operator<<(this,*local_80);
  poVar2 = std::operator<<(poVar2,":");
  std::ostream::operator<<(poVar2,std::dec);
  local_68 = local_80;
  if ((*local_80 & 3) == 0) {
    std::operator<<(local_78,"R");
  }
  else {
    local_60 = local_80;
    if ((*local_80 & 3) == 1) {
      std::operator<<(local_78,"S");
    }
    else {
      local_58 = local_80;
      if ((*local_80 & 3) == 3) {
        std::operator<<(local_78,"C");
      }
      else {
        std::operator<<(local_78,"M");
      }
    }
  }
  for (local_88 = -1; local_88 < 2; local_88 = local_88 + 1) {
    for (local_8c = -1; local_8c < 2; local_8c = local_8c + 1) {
      for (local_90 = -1; poVar2 = local_78, puVar1 = local_80, local_90 < 2;
          local_90 = local_90 + 1) {
        IntVect::IntVect(&local_9c,local_90,local_8c,local_88);
        local_38 = puVar1;
        local_40 = &local_9c;
        local_c = 0;
        local_1c = 1;
        local_2c = 2;
        local_50 = local_9c.vect[0] + 0x12 + local_9c.vect[1] * 3 + local_9c.vect[2] * 9;
        local_28 = local_40;
        local_18 = local_40;
        local_8 = local_40;
        std::ostream::operator<<(poVar2,(uint)((*puVar1 & 1 << ((byte)local_50 & 0x1f)) != 0));
      }
    }
  }
  std::ios_base::flags((ios_base *)(local_78 + *(long *)(*(long *)local_78 + -0x18)),local_84);
  return local_78;
}

Assistant:

std::ostream&
operator<< (std::ostream& os, const EBCellFlag& flag)
{
    std::ios_base::fmtflags old_fmt = os.flags();
    os << std::hex << flag.getValue() << ":" << std::dec;

    if (flag.isRegular()) {
        os << "R";
    } else if (flag.isSingleValued()) {
        os << "S";
    } else if (flag.isCovered()) {
        os << "C";
    } else {
        os << "M";
    }

#if (AMREX_SPACEDIM == 3)
    for (int k = -1; k <= 1; ++k) {
#endif
        for (int j = -1; j <= 1; ++j) {
            for (int i = -1; i <= 1; ++i) {
                os << static_cast<int>(flag.isConnected(IntVect{AMREX_D_DECL(i,j,k)}));
            }
        }
#if (AMREX_SPACEDIM == 3)
    }
#endif

    os.flags(old_fmt);

    return os;
}